

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O1

int publickey_response_success(LIBSSH2_PUBLICKEY *pkey)

{
  LIBSSH2_SESSION *session;
  uchar *puVar1;
  int iVar2;
  uint32_t uVar3;
  ulong uVar4;
  char *errmsg;
  int unaff_R13D;
  int iVar5;
  uchar *data;
  uchar *s;
  size_t data_len;
  uchar *local_50;
  int local_44;
  uchar *local_40;
  ulong local_38;
  
  session = pkey->channel->session;
  do {
    iVar2 = publickey_packet_receive(pkey,&local_50,&local_38);
    uVar4 = local_38;
    puVar1 = local_50;
    iVar5 = 1;
    if (iVar2 != -0x25) {
      if (iVar2 == 0) {
        local_44 = unaff_R13D;
        if (local_38 < 4) {
          iVar2 = _libssh2_error(session,-0x26,"Publickey response too small");
        }
        else {
          local_40 = local_50;
          iVar2 = publickey_response_id(&local_40,local_38);
          if (iVar2 == 0) {
            if (uVar4 < 8) {
              iVar2 = _libssh2_error(session,-0x26,"Publickey response too small");
            }
            else {
              uVar3 = _libssh2_ntohu32(local_40);
              (*session->free)(puVar1,&session->abstract);
              if (uVar3 == 0) {
                iVar2 = 0;
              }
              else {
                if (uVar3 == 6) {
                  uVar4 = (ulong)(pkey->version == 1) | 6;
                }
                else {
                  uVar4 = (ulong)uVar3;
                }
                errmsg = "unknown";
                if ((uint)uVar4 < 9) {
                  errmsg = publickey_status_codes[uVar4].name;
                }
                _libssh2_error(session,-0x24,errmsg);
                iVar5 = 5;
                iVar2 = local_44;
              }
            }
          }
          else {
            (*session->free)(puVar1,&session->abstract);
            if (iVar2 < 0) {
              iVar2 = _libssh2_error(session,-0x24,"Invalid publickey subsystem response");
            }
            else {
              _libssh2_error(session,-0x24,"Unexpected publickey subsystem response");
              local_50 = (uchar *)0x0;
              iVar5 = 0;
              iVar2 = local_44;
            }
          }
        }
      }
      else {
        iVar2 = _libssh2_error(session,-0x1e,"Timeout waiting for response from publickey subsystem"
                              );
      }
    }
    unaff_R13D = iVar2;
  } while (iVar5 == 0);
  if (iVar5 == 5) {
    unaff_R13D = -1;
  }
  return unaff_R13D;
}

Assistant:

static int
publickey_response_success(LIBSSH2_PUBLICKEY * pkey)
{
    LIBSSH2_SESSION *session = pkey->channel->session;
    unsigned char *data, *s;
    size_t data_len;
    int response;

    for(;;) {
        int rc = publickey_packet_receive(pkey, &data, &data_len);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_TIMEOUT,
                                  "Timeout waiting for response from "
                                  "publickey subsystem");
        }

        if(data_len < 4) {
            return _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                  "Publickey response too small");
        }

        s = data;
        response = publickey_response_id(&s, data_len);

        switch(response) {
        case LIBSSH2_PUBLICKEY_RESPONSE_STATUS:
            /* Error, or processing complete */
        {
            unsigned long status = 0;

            if(data_len < 8) {
                return _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                      "Publickey response too small");
            }

            status = _libssh2_ntohu32(s);

            LIBSSH2_FREE(session, data);

            if(status == LIBSSH2_PUBLICKEY_SUCCESS)
                return 0;

            publickey_status_error(pkey, session, status);
            goto err_exit;
        }
        default:
            LIBSSH2_FREE(session, data);
            if(response < 0) {
                return _libssh2_error(session,
                                      LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                                      "Invalid publickey subsystem response");
            }
            /* Unknown/Unexpected */
            _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                           "Unexpected publickey subsystem response");
            data = NULL;
        }
    }
err_exit:
    return -1;
}